

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# route.c
# Opt level: O3

route_type_t parse_route_type(char *value)

{
  switch(*value) {
  case '0':
    if (value[1] == '\0') {
      return RT_STREET_LEVEL;
    }
    break;
  case '1':
    if (value[1] == '\0') {
      return RT_UNDERGROUND;
    }
    break;
  case '2':
    if (value[1] == '\0') {
      return RT_LONG_RAIL;
    }
    break;
  case '3':
    if (value[1] == '\0') {
      return RT_BUS;
    }
    break;
  case '4':
    if (value[1] == '\0') {
      return RT_FERRY;
    }
    break;
  case '5':
    if (value[1] == '\0') {
      return RT_CABLE_CAR;
    }
    break;
  case '6':
    return (uint)(value[1] != '\0') * 2 + RT_SUSPENDED;
  case '7':
    return RT_NOT_SET - (value[1] == '\0');
  }
  return RT_NOT_SET;
}

Assistant:

route_type_t parse_route_type(const char *value) {
    if (strcmp(value, "0") == 0)
        return RT_STREET_LEVEL;
    else if (strcmp(value, "1") == 0)
        return RT_UNDERGROUND;
    else if (strcmp(value, "2") == 0)
        return RT_LONG_RAIL;
    else if (strcmp(value, "3") == 0)
        return RT_BUS;
    else if (strcmp(value, "4") == 0)
        return RT_FERRY;
    else if (strcmp(value, "5") == 0)
        return RT_CABLE_CAR;
    else if (strcmp(value, "6") == 0)
        return RT_SUSPENDED;
    else if (strcmp(value, "7") == 0)
        return RT_FUNICULAR;
    else
        return RT_NOT_SET;
}